

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int fetch_picked_ref_frames_mask(MACROBLOCK *x,BLOCK_SIZE bsize,int mib_size)

{
  uint uVar1;
  uint uVar2;
  int j;
  int i;
  int picked_ref_frames_mask;
  int mi_h;
  int mi_w;
  int mi_col_in_sb;
  int mi_row_in_sb;
  int mi_col;
  int mi_row;
  MACROBLOCKD *xd;
  int sb_size_mask;
  int mib_size_local;
  BLOCK_SIZE bsize_local;
  MACROBLOCK *x_local;
  
  uVar2 = (x->e_mbd).mi_col & mib_size - 1U;
  picked_ref_frames_mask = 0;
  uVar1 = (x->e_mbd).mi_row & mib_size - 1U;
  for (i = uVar1; j = uVar2,
      i < (int)(uVar1 + "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [bsize]); i = i + 1) {
    for (; j < (int)(uVar2 + "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [bsize]); j = j + 1) {
      picked_ref_frames_mask = x->picked_ref_frames_mask[i * 0x20 + j] | picked_ref_frames_mask;
    }
  }
  return picked_ref_frames_mask;
}

Assistant:

static int fetch_picked_ref_frames_mask(const MACROBLOCK *const x,
                                        BLOCK_SIZE bsize, int mib_size) {
  const int sb_size_mask = mib_size - 1;
  const MACROBLOCKD *const xd = &x->e_mbd;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_row_in_sb = mi_row & sb_size_mask;
  const int mi_col_in_sb = mi_col & sb_size_mask;
  const int mi_w = mi_size_wide[bsize];
  const int mi_h = mi_size_high[bsize];
  int picked_ref_frames_mask = 0;
  for (int i = mi_row_in_sb; i < mi_row_in_sb + mi_h; ++i) {
    for (int j = mi_col_in_sb; j < mi_col_in_sb + mi_w; ++j) {
      picked_ref_frames_mask |= x->picked_ref_frames_mask[i * 32 + j];
    }
  }
  return picked_ref_frames_mask;
}